

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O2

parser_error visuals_parse_cycle(parser *parser)

{
  char *__s2;
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  char *pcVar4;
  char *name;
  visuals_color_cycle *pvVar5;
  parser_error pVar6;
  long lVar7;
  ulong uVar8;
  long lVar10;
  bool bVar11;
  long lVar9;
  
  pvVar2 = parser_priv(parser);
  pVar6 = PARSE_ERROR_INTERNAL;
  if (pvVar2 != (void *)0x0) {
    uVar3 = *(long *)((long)pvVar2 + 0x20) + 1;
    *(ulong *)((long)pvVar2 + 0x20) = uVar3;
    if (uVar3 < *(ulong *)((long)pvVar2 + 0x18)) {
      pcVar4 = parser_getsym(parser,"group");
      pVar6 = PARSE_ERROR_INVALID_VALUE;
      if ((((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) &&
          (name = parser_getsym(parser,"name"), name != (char *)0x0)) && (*name != '\0')) {
        if (*(long *)(*(long *)((long)pvVar2 + 0x10) + *(long *)((long)pvVar2 + 0x20) * 8) == 0) {
          pvVar5 = visuals_color_cycle_new(name,0x20,0xff);
          lVar10 = *(long *)((long)pvVar2 + 0x20);
          *(visuals_color_cycle **)(*(long *)((long)pvVar2 + 0x10) + lVar10 * 8) = pvVar5;
          if (*(long *)(*(long *)((long)pvVar2 + 0x10) + lVar10 * 8) == 0) {
            return PARSE_ERROR_INTERNAL;
          }
        }
        lVar10 = *(long *)((long)pvVar2 + 0x38);
        for (lVar7 = 0; lVar9 = lVar10, lVar10 != lVar7; lVar7 = lVar7 + 1) {
          __s2 = *(char **)(*(long *)((long)pvVar2 + 0x30) + lVar7 * 8);
          lVar9 = lVar7;
          if (__s2 == (char *)0x0) {
            pcVar4 = string_make(pcVar4);
            *(char **)(*(long *)((long)pvVar2 + 0x30) + lVar7 * 8) = pcVar4;
            break;
          }
          iVar1 = strcmp(pcVar4,__s2);
          if (iVar1 == 0) break;
        }
        uVar8 = lVar9 << 6;
        uVar3 = *(ulong *)((long)pvVar2 + 0x48);
        lVar10 = 0x40;
        while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
          if (uVar8 < uVar3) {
            lVar7 = *(long *)((long)pvVar2 + 0x40);
            lVar9 = *(long *)(lVar7 + uVar8 * 8);
            if ((lVar9 == 0) ||
               ((pcVar4 = *(char **)(lVar9 + 0x10), pcVar4 != (char *)0x0 &&
                (iVar1 = strcmp(name,pcVar4), iVar1 == 0)))) {
              *(undefined8 *)(lVar7 + uVar8 * 8) =
                   *(undefined8 *)
                    (*(long *)((long)pvVar2 + 0x10) + *(long *)((long)pvVar2 + 0x20) * 8);
              break;
            }
          }
          uVar8 = uVar8 + 1;
        }
        *(undefined8 *)((long)pvVar2 + 0x28) = 0;
        pVar6 = PARSE_ERROR_NONE;
      }
    }
    else {
      pVar6 = PARSE_ERROR_TOO_MANY_ENTRIES;
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error visuals_parse_cycle(struct parser *parser)
{
	struct visuals_parse_context *context = parser_priv(parser);
	const char *parsed_group = NULL;
	const char *parsed_name = NULL;
	size_t i = 0;
	size_t current_group_index = 0;

	if (context == NULL) {
		return PARSE_ERROR_INTERNAL;
	}

	/* Move to the next available slot in the cycle list. This will start the
	 * list at 1 (instead of zero), but we need to use cycles_index to keep
	 * track of which cycle we will be adding colors to. */
	context->cycles_index++;

	if (context->cycles_index >= context->max_cycles) {
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}

	parsed_group = parser_getsym(parser, "group");

	if (parsed_group == NULL || strlen(parsed_group) == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	parsed_name = parser_getsym(parser, "name");

	if (parsed_name == NULL || strlen(parsed_name) == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Create a new cycle with the maximum number of steps (if we can),
	 * otherwise bail. */
	if (context->cycles[context->cycles_index] == NULL) {
		context->cycles[context->cycles_index] = visuals_color_cycle_new(parsed_name,
																		 VISUALS_STEPS_MAX,
																		 VISUALS_INVALID_COLOR);

		if (context->cycles[context->cycles_index] == NULL) {
			return PARSE_ERROR_INTERNAL;
		}
	}

	/* Find the group that matches the parsed cycle's group or create a new one
	 * if not found. */
	current_group_index = context->max_groups;

	for (i = 0; i < context->max_groups; i++) {
		if (context->group_names[i] == NULL) {
			context->group_names[i] = string_make(parsed_group);
			current_group_index = i;
			break;
		}
		else {
			const char *existing_group = context->group_names[i];

			if (existing_group != NULL && streq(parsed_group, existing_group)) {
				current_group_index = i;
				break;
			}
		}
	}

	/* Assign the parsed cycle to its group. If a cycle with a matching name is
	 * found, the parsed cycle replaces that one, otherwise, it is added to the
	 * end of the group. */
	for (i = 0; i < VISUALS_CYCLES_MAX; i++) {
		size_t offset = current_group_index * VISUALS_CYCLES_MAX + i;

		if (offset >= context->max_group_cycles) {
			continue;
		}

		if (context->group_cycles[offset] == NULL) {
			context->group_cycles[offset] = context->cycles[context->cycles_index];
			break;
		}
		else {
			const char *existing_name = context->group_cycles[offset]->cycle_name;

			if (existing_name != NULL && streq(parsed_name, existing_name)) {
				context->group_cycles[offset] = context->cycles[context->cycles_index];
				break;
			}
		}
	}

	/* Reset the step index before we start adding colors to the cycle. */
	context->cycle_step_index = 0;

	return PARSE_ERROR_NONE;
}